

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

Z80Cond Z80::getz80cond_Z80(char **p)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  char p1;
  char p0;
  char *pp;
  char **p_local;
  
  iVar4 = SkipBlanks(p);
  if (iVar4 == 0) {
    pcVar1 = *p;
    bVar2 = **p | 0x20;
    iVar4 = islabchar((*p)[1]);
    if (iVar4 == 0) {
      *p = *p + 1;
      switch(bVar2) {
      case 99:
        p_local._4_4_ = Z80C_C;
        break;
      default:
        *p = pcVar1;
        p_local._4_4_ = Z80C_UNK;
        break;
      case 0x6d:
        p_local._4_4_ = Z80C_M;
        break;
      case 0x70:
        p_local._4_4_ = Z80C_P;
        break;
      case 0x73:
        p_local._4_4_ = Z80C_M;
        break;
      case 0x7a:
        p_local._4_4_ = Z80C_Z;
      }
    }
    else if (((**p ^ (*p)[1]) & 0x20U) == 0) {
      iVar4 = islabchar((*p)[2]);
      if (iVar4 == 0) {
        bVar3 = (*p)[1] | 0x20;
        *p = *p + 2;
        if (bVar2 == 0x6e) {
          if (bVar3 == 99) {
            return Z80C_NC;
          }
          if (bVar3 == 0x73) {
            return Z80C_P;
          }
          if (bVar3 == 0x7a) {
            return Z80C_NZ;
          }
        }
        else if (bVar2 == 0x70) {
          if (bVar3 == 0x65) {
            return Z80C_PE;
          }
          if (bVar3 == 0x6f) {
            return Z80C_PO;
          }
        }
        *p = pcVar1;
        p_local._4_4_ = Z80C_UNK;
      }
      else {
        p_local._4_4_ = Z80C_UNK;
      }
    }
    else {
      p_local._4_4_ = Z80C_UNK;
    }
  }
  else {
    p_local._4_4_ = Z80C_UNK;
  }
  return p_local._4_4_;
}

Assistant:

static Z80Cond getz80cond_Z80(char*& p) {
		if (SkipBlanks(p)) return Z80C_UNK;	// EOL detected
		char * const pp = p;
		const char p0 = 0x20|p[0];		// lowercase ASCII conversion
		if (!islabchar(p[1])) {			// can be only single letter condition at most
			++p;
			switch (p0) {
				case 'z': return Z80C_Z;
				case 'c': return Z80C_C;
				case 'p': return Z80C_P;
				case 'm': return Z80C_M;
				case 's': return Z80C_M;
			}
			p = pp;
			return Z80C_UNK;
		}
		// ## p0 != 0 && p1 is label character
		if ((p[0]^p[1])&0x20) return Z80C_UNK;	// different case of the letters detected
		if (islabchar(p[2])) return Z80C_UNK;	// p2 is also label character = too many
		const char p1 = 0x20|p[1];		// lowercase ASCII conversion
		p += 2;
		if ('n' == p0) {
			switch (p1) {
				case 'z': return Z80C_NZ;	// nz
				case 'c': return Z80C_NC;	// nc
				case 's': return Z80C_P;	// ns
			}
		} else if ('p' == p0) {
			switch (p1) {
				case 'o': return Z80C_PO;	// po
				case 'e': return Z80C_PE;	// pe
			}
		}
		p = pp;
		return Z80C_UNK;
	}